

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_crg_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  int iVar2;
  jpc_crgcomp_t *pjVar3;
  
  if (0 < (ms->parms).soc) {
    pjVar3 = (ms->parms).crg.comps;
    iVar2 = 0;
    do {
      iVar1 = jpc_putuint16(out,pjVar3->hoff);
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = jpc_putuint16(out,pjVar3->voff);
      if (iVar1 != 0) {
        return -1;
      }
      iVar2 = iVar2 + 1;
      pjVar3 = pjVar3 + 1;
    } while (iVar2 < (ms->parms).soc);
  }
  return 0;
}

Assistant:

static int jpc_crg_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_crg_t *crg = &ms->parms.crg;
	int compno;
	jpc_crgcomp_t *comp;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	for (compno = 0, comp = crg->comps; compno < crg->numcomps; ++compno,
	  ++comp) {
		if (jpc_putuint16(out, comp->hoff) ||
		  jpc_putuint16(out, comp->voff)) {
			return -1;
		}
	}
	return 0;
}